

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

void Curl_verboseconnect(Curl_easy *data,connectdata *conn)

{
  uint uVar1;
  long lVar2;
  
  if (((data->set).field_0x8e5 & 8) == 0) {
    return;
  }
  uVar1 = *(uint *)&(conn->bits).field_0x4;
  lVar2 = 0xf0;
  if ((((uVar1 & 2) == 0) && (lVar2 = 0x130, (uVar1 & 1) == 0)) &&
     (lVar2 = 0xd0, (uVar1 >> 9 & 1) == 0)) {
    lVar2 = 0xa0;
  }
  Curl_infof(data,"Connected to %s (%s) port %u (#%ld)",
             *(undefined8 *)((conn->chunk).hexbuffer + lVar2 + -0x3d),conn->primary_ip,
             (ulong)(uint)conn->port,conn->connection_id);
  return;
}

Assistant:

void Curl_verboseconnect(struct Curl_easy *data,
                         struct connectdata *conn)
{
  if(data->set.verbose)
    infof(data, "Connected to %s (%s) port %u (#%ld)",
#ifndef CURL_DISABLE_PROXY
          conn->bits.socksproxy ? conn->socks_proxy.host.dispname :
          conn->bits.httpproxy ? conn->http_proxy.host.dispname :
#endif
          conn->bits.conn_to_host ? conn->conn_to_host.dispname :
          conn->host.dispname,
          conn->primary_ip, conn->port, conn->connection_id);
}